

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int has_ext(char *ext)

{
  byte *__haystack;
  char **ppcVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  
  ppcVar1 = exts_i;
  pbVar6 = (byte *)exts;
  if (max_loaded_major < 3) {
    if ((ext != (char *)0x0 && exts != (char *)0x0) &&
       (pbVar3 = (byte *)strstr(exts,ext), pbVar3 != (byte *)0x0)) {
      sVar4 = strlen(ext);
      do {
        __haystack = pbVar3 + sVar4;
        if (((pbVar3 == pbVar6) || (pbVar3[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
          return 1;
        }
        pbVar3 = (byte *)strstr((char *)__haystack,ext);
        pbVar6 = __haystack;
      } while (pbVar3 != (byte *)0x0);
    }
  }
  else if ((exts_i != (char **)0x0) && (lVar7 = (long)num_exts_i, 0 < lVar7)) {
    lVar5 = 0;
    do {
      if ((ppcVar1[lVar5] != (char *)0x0) && (iVar2 = strcmp(ppcVar1[lVar5],ext), iVar2 == 0)) {
        return 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  return 0;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;
        if(exts_i == NULL) return 0;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(exts_i[index] != NULL && strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}